

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_LU_invmult(m2v *LU,int rank,int *rowperm,int *colperm,m2v *Y,m2v *X_out)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  m2v_base *pmVar4;
  m2v_base *pmVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (rank == -1) {
    rank = LU->n_row;
    if (LU->n_col < LU->n_row) {
      rank = LU->n_col;
    }
  }
  iVar13 = X_out->n_row;
  if (rank < iVar13) {
    lVar8 = (long)rank;
    uVar12 = (ulong)(uint)X_out->row_stride;
    do {
      iVar11 = (int)uVar12;
      if (0 < iVar11) {
        iVar13 = colperm[lVar8];
        pmVar4 = X_out->e;
        lVar10 = 0;
        do {
          pmVar4[(long)iVar11 * (long)iVar13 + lVar10] = 0;
          lVar10 = lVar10 + 1;
          uVar12 = (ulong)X_out->row_stride;
        } while (lVar10 < (long)uVar12);
        iVar13 = X_out->n_row;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar13);
  }
  if (0 < rank) {
    uVar14 = (ulong)(uint)X_out->row_stride;
    uVar12 = 0;
    do {
      iVar13 = (int)uVar14;
      if (0 < iVar13) {
        iVar11 = colperm[uVar12];
        iVar2 = rowperm[uVar12];
        iVar3 = Y->row_stride;
        pmVar4 = Y->e;
        pmVar5 = X_out->e;
        lVar8 = 0;
        do {
          pmVar5[(long)iVar13 * (long)iVar11 + lVar8] = pmVar4[(long)iVar3 * (long)iVar2 + lVar8];
          lVar8 = lVar8 + 1;
          uVar14 = (ulong)X_out->row_stride;
        } while (lVar8 < (long)uVar14);
      }
      if (uVar12 != 0) {
        pmVar4 = LU->e;
        uVar15 = 0;
        do {
          if (((pmVar4[(int)(((uint)(uVar15 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar12)] >>
                ((uint)uVar15 & 0x1f) & 1) != 0) && (iVar13 = (int)uVar14, 0 < iVar13)) {
            iVar11 = colperm[uVar15];
            iVar2 = colperm[uVar12];
            pmVar5 = X_out->e;
            lVar8 = 0;
            do {
              puVar1 = pmVar5 + (long)iVar2 * (long)iVar13 + lVar8;
              *puVar1 = *puVar1 ^ pmVar5[(long)iVar11 * (long)iVar13 + lVar8];
              lVar8 = lVar8 + 1;
              uVar14 = (ulong)X_out->row_stride;
            } while (lVar8 < (long)uVar14);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar12);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)rank);
    if (0 < rank) {
      iVar13 = LU->n_col;
      uVar12 = (ulong)(uint)rank;
      do {
        uVar14 = uVar12 - 1;
        if ((long)uVar12 < (long)iVar13) {
          pmVar4 = LU->e;
          uVar15 = uVar12;
          do {
            uVar7 = (uint)uVar15;
            uVar9 = uVar7 + 0x1f;
            if (-1 < (int)uVar7) {
              uVar9 = uVar7;
            }
            if (((pmVar4[((int)uVar9 >> 5) + LU->row_stride * (int)uVar14] >> (uVar7 & 0x1f) & 1) !=
                 0) && (lVar8 = (long)X_out->row_stride, 0 < lVar8)) {
              iVar13 = colperm[uVar15];
              iVar11 = colperm[uVar14];
              pmVar5 = X_out->e;
              lVar10 = 0;
              do {
                puVar1 = pmVar5 + iVar11 * lVar8 + lVar10;
                *puVar1 = *puVar1 ^ pmVar5[iVar13 * lVar8 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 < X_out->row_stride);
              iVar13 = LU->n_col;
            }
            uVar15 = uVar15 + 1;
          } while ((int)uVar15 < iVar13);
        }
        bVar6 = 1 < (long)uVar12;
        uVar12 = uVar14;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}